

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void * nk_font_atlas_bake(nk_font_atlas *atlas,int *width,int *height,nk_font_atlas_format fmt)

{
  long lVar1;
  float pixel_height;
  nk_rune fallback_codepoint;
  nk_plugin_free p_Var2;
  nk_font_glyph *glyphs;
  nk_baked_font *baked_font;
  int iVar3;
  nk_font *pnVar4;
  nk_font_baker *baker_00;
  undefined8 uVar5;
  void *out_memory;
  nk_handle atlas_00;
  long lVar6;
  nk_cursor *cursor;
  nk_font_config *config;
  nk_font *font;
  void *img_rgba;
  nk_font_baker *baker;
  nk_font *font_iter;
  nk_size img_size;
  nk_size tmp_size;
  void *tmp;
  int i;
  nk_font_atlas_format fmt_local;
  int *height_local;
  int *width_local;
  nk_font_atlas *atlas_local;
  
  tmp._0_4_ = 0;
  tmp_size = 0;
  tmp._4_4_ = fmt;
  _i = height;
  height_local = width;
  width_local = (int *)atlas;
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x353f,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if ((atlas->temporary).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->temporary.alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x3540,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if ((atlas->temporary).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->temporary.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x3541,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if ((atlas->permanent).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->permanent.alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x3542,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if ((atlas->permanent).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->permanent.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x3543,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if (width == (int *)0x0) {
    __assert_fail("width",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x3545,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if (height == (int *)0x0) {
    __assert_fail("height",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x3546,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if ((((atlas == (nk_font_atlas *)0x0) || (width == (int *)0x0)) || (height == (int *)0x0)) ||
     ((((atlas->temporary).alloc == (nk_plugin_alloc)0x0 ||
       ((atlas->temporary).free == (nk_plugin_free)0x0)) ||
      (((atlas->permanent).alloc == (nk_plugin_alloc)0x0 ||
       ((atlas->permanent).free == (nk_plugin_free)0x0)))))) {
    return (void *)0x0;
  }
  if (atlas->font_num == 0) {
    pnVar4 = nk_font_atlas_add_default(atlas,13.0,(nk_font_config *)0x0);
    *(nk_font **)(width_local + 0x5c) = pnVar4;
  }
  if (width_local[0x62] == 0) {
    __assert_fail("atlas->font_num",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x3551,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if (width_local[0x62] == 0) {
    return (void *)0x0;
  }
  nk_font_baker_memory
            (&img_size,width_local + 0x58,*(nk_font_config **)(width_local + 0x60),width_local[0x62]
            );
  tmp_size = (**(code **)(width_local + 0xc))(*(undefined8 *)(width_local + 10),0,img_size);
  if ((void *)tmp_size == (void *)0x0) {
    __assert_fail("tmp",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x3557,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if ((void *)tmp_size != (void *)0x0) {
    baker_00 = nk_font_baker((void *)tmp_size,width_local[0x58],width_local[0x62],
                             (nk_allocator *)(width_local + 10));
    uVar5 = (**(code **)(width_local + 6))
                      (*(undefined8 *)(width_local + 4),0,(long)width_local[0x58] * 0x30);
    *(undefined8 *)(width_local + 0x5a) = uVar5;
    if (*(long *)(width_local + 0x5a) == 0) {
      __assert_fail("atlas->glyphs",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                    ,0x355e,
                    "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                   );
    }
    if (*(long *)(width_local + 0x5a) != 0) {
      *(undefined2 *)(width_local + 0x11) = 0xb5;
      *(undefined2 *)((long)width_local + 0x46) = 0x1c;
      iVar3 = nk_font_bake_pack(baker_00,(nk_size *)&font_iter,height_local,_i,
                                (nk_recti *)(width_local + 0x10),
                                *(nk_font_config **)(width_local + 0x60),width_local[0x62],
                                (nk_allocator *)(width_local + 10));
      if (iVar3 != 0) {
        uVar5 = (**(code **)(width_local + 0xc))(*(undefined8 *)(width_local + 10),0,font_iter);
        *(undefined8 *)width_local = uVar5;
        if (*(long *)width_local == 0) {
          __assert_fail("atlas->pixel",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                        ,0x356b,
                        "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                       );
        }
        if (*(long *)width_local != 0) {
          nk_font_bake(baker_00,*(void **)width_local,*height_local,*_i,
                       *(nk_font_glyph **)(width_local + 0x5a),width_local[0x58],
                       *(nk_font_config **)(width_local + 0x60),width_local[0x62]);
          nk_font_bake_custom_data
                    (*(void **)width_local,*height_local,*_i,*(nk_recti *)(width_local + 0x10),
                     "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...XXX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..XX.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.XX..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XXX...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           X.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            X..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       ------------------------------------X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           XX    X..X  -       - X.....X -        X.....X        -   X.X           X.X   -                 X..X          -  X...X  -         X...X         -  X..X           X..X  -                  XX           -   X.X   -          X.X          - X...XXXXXXXXXXXXX...X -           ------------        -    X    -           X           -X..............." /* TRUNCATED STRING LITERAL */
                     ,0x5a,0x1b,'.','X');
          if (tmp._4_4_ == NK_FONT_ATLAS_RGBA32) {
            out_memory = (void *)(**(code **)(width_local + 0xc))
                                           (*(undefined8 *)(width_local + 10),0,
                                            (long)(*height_local * *_i * 4));
            if (out_memory == (void *)0x0) {
              __assert_fail("img_rgba",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                            ,0x3579,
                            "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                           );
            }
            if (out_memory == (void *)0x0) goto LAB_0012c019;
            nk_font_bake_convert(out_memory,*height_local,*_i,*(void **)width_local);
            (**(code **)(width_local + 0xe))
                      (*(undefined8 *)(width_local + 10),*(undefined8 *)width_local);
            *(void **)width_local = out_memory;
          }
          width_local[2] = *height_local;
          width_local[3] = *_i;
          for (baker = *(nk_font_baker **)(width_local + 0x5e); baker != (nk_font_baker *)0x0;
              baker = (nk_font_baker *)(baker->alloc).userdata.ptr) {
            p_Var2 = baker[1].alloc.free;
            pixel_height = *(float *)(p_Var2 + 0x20);
            fallback_codepoint = *(nk_rune *)(p_Var2 + 0x40);
            glyphs = *(nk_font_glyph **)(width_local + 0x5a);
            baked_font = *(nk_baked_font **)(p_Var2 + 0x38);
            atlas_00 = nk_handle_ptr((void *)0x0);
            nk_font_init((nk_font *)baker,pixel_height,fallback_codepoint,glyphs,baked_font,atlas_00
                        );
          }
          for (tmp._0_4_ = 0; (int)tmp < 7; tmp._0_4_ = (int)tmp + 1) {
            lVar6 = (long)(int)tmp;
            lVar1 = lVar6 * 0x28;
            *(short *)(width_local + lVar6 * 10 + 0x14) = (short)*height_local;
            *(short *)((long)width_local + lVar1 + 0x52) = (short)*_i;
            *(short *)(width_local + lVar6 * 10 + 0x15) =
                 (short)(int)((float)(int)(short)width_local[0x10] +
                             nk_font_atlas_bake::nk_cursor_data[(int)tmp][0].x);
            *(short *)((long)width_local + lVar1 + 0x56) =
                 (short)(int)((float)(int)*(short *)((long)width_local + 0x42) +
                             nk_font_atlas_bake::nk_cursor_data[(int)tmp][0].y);
            *(short *)(width_local + lVar6 * 10 + 0x16) =
                 (short)(int)nk_font_atlas_bake::nk_cursor_data[(int)tmp][1].x;
            *(short *)((long)width_local + lVar1 + 0x5a) =
                 (short)(int)nk_font_atlas_bake::nk_cursor_data[(int)tmp][1].y;
            *(nk_vec2 *)(width_local + lVar6 * 10 + 0x18) =
                 nk_font_atlas_bake::nk_cursor_data[(int)tmp][1];
            *(nk_vec2 *)(width_local + lVar6 * 10 + 0x1a) =
                 nk_font_atlas_bake::nk_cursor_data[(int)tmp][2];
          }
          (**(code **)(width_local + 0xe))(*(undefined8 *)(width_local + 10),tmp_size);
          return *(void **)width_local;
        }
      }
    }
  }
LAB_0012c019:
  if (tmp_size != 0) {
    (**(code **)(width_local + 0xe))(*(undefined8 *)(width_local + 10),tmp_size);
  }
  if (*(long *)(width_local + 0x5a) != 0) {
    (**(code **)(width_local + 8))
              (*(undefined8 *)(width_local + 4),*(undefined8 *)(width_local + 0x5a));
    width_local[0x5a] = 0;
    width_local[0x5b] = 0;
  }
  if (*(long *)width_local != 0) {
    (**(code **)(width_local + 0xe))(*(undefined8 *)(width_local + 10),*(undefined8 *)width_local);
    width_local[0] = 0;
    width_local[1] = 0;
  }
  return (void *)0x0;
}

Assistant:

NK_API const void*
nk_font_atlas_bake(struct nk_font_atlas *atlas, int *width, int *height,
    enum nk_font_atlas_format fmt)
{
    int i = 0;
    void *tmp = 0;
    nk_size tmp_size, img_size;
    struct nk_font *font_iter;
    struct nk_font_baker *baker;

    NK_ASSERT(atlas);
    NK_ASSERT(atlas->temporary.alloc);
    NK_ASSERT(atlas->temporary.free);
    NK_ASSERT(atlas->permanent.alloc);
    NK_ASSERT(atlas->permanent.free);

    NK_ASSERT(width);
    NK_ASSERT(height);
    if (!atlas || !width || !height ||
        !atlas->temporary.alloc || !atlas->temporary.free ||
        !atlas->permanent.alloc || !atlas->permanent.free)
        return 0;

#ifdef NK_INCLUDE_DEFAULT_FONT
    /* no font added so just use default font */
    if (!atlas->font_num)
        atlas->default_font = nk_font_atlas_add_default(atlas, 13.0f, 0);
#endif
    NK_ASSERT(atlas->font_num);
    if (!atlas->font_num) return 0;

    /* allocate temporary baker memory required for the baking process */
    nk_font_baker_memory(&tmp_size, &atlas->glyph_count, atlas->config, atlas->font_num);
    tmp = atlas->temporary.alloc(atlas->temporary.userdata,0, tmp_size);
    NK_ASSERT(tmp);
    if (!tmp) goto failed;

    /* allocate glyph memory for all fonts */
    baker = nk_font_baker(tmp, atlas->glyph_count, atlas->font_num, &atlas->temporary);
    atlas->glyphs = (struct nk_font_glyph*)atlas->permanent.alloc(
        atlas->permanent.userdata,0, sizeof(struct nk_font_glyph)*(nk_size)atlas->glyph_count);
    NK_ASSERT(atlas->glyphs);
    if (!atlas->glyphs)
        goto failed;

    /* pack all glyphs into a tight fit space */
    atlas->custom.w = (NK_CURSOR_DATA_W*2)+1;
    atlas->custom.h = NK_CURSOR_DATA_H + 1;
    if (!nk_font_bake_pack(baker, &img_size, width, height, &atlas->custom,
        atlas->config, atlas->font_num, &atlas->temporary))
        goto failed;

    /* allocate memory for the baked image font atlas */
    atlas->pixel = atlas->temporary.alloc(atlas->temporary.userdata,0, img_size);
    NK_ASSERT(atlas->pixel);
    if (!atlas->pixel)
        goto failed;

    /* bake glyphs and custom white pixel into image */
    nk_font_bake(baker, atlas->pixel, *width, *height,
        atlas->glyphs, atlas->glyph_count, atlas->config, atlas->font_num);
    nk_font_bake_custom_data(atlas->pixel, *width, *height, atlas->custom,
            nk_custom_cursor_data, NK_CURSOR_DATA_W, NK_CURSOR_DATA_H, '.', 'X');

    if (fmt == NK_FONT_ATLAS_RGBA32) {
        /* convert alpha8 image into rgba32 image */
        void *img_rgba = atlas->temporary.alloc(atlas->temporary.userdata,0,
                            (nk_size)(*width * *height * 4));
        NK_ASSERT(img_rgba);
        if (!img_rgba) goto failed;
        nk_font_bake_convert(img_rgba, *width, *height, atlas->pixel);
        atlas->temporary.free(atlas->temporary.userdata, atlas->pixel);
        atlas->pixel = img_rgba;
    }
    atlas->tex_width = *width;
    atlas->tex_height = *height;

    /* initialize each font */
    for (font_iter = atlas->fonts; font_iter; font_iter = font_iter->next) {
        struct nk_font *font = font_iter;
        struct nk_font_config *config = font->config;
        nk_font_init(font, config->size, config->fallback_glyph, atlas->glyphs,
            config->font, nk_handle_ptr(0));
    }

    /* initialize each cursor */
    {NK_STORAGE const struct nk_vec2 nk_cursor_data[NK_CURSOR_COUNT][3] = {
        /* Pos      Size        Offset */
        {{ 0, 3},   {12,19},    { 0, 0}},
        {{13, 0},   { 7,16},    { 4, 8}},
        {{31, 0},   {23,23},    {11,11}},
        {{21, 0},   { 9, 23},   { 5,11}},
        {{55,18},   {23, 9},    {11, 5}},
        {{73, 0},   {17,17},    { 9, 9}},
        {{55, 0},   {17,17},    { 9, 9}}
    };
    for (i = 0; i < NK_CURSOR_COUNT; ++i) {
        struct nk_cursor *cursor = &atlas->cursors[i];
        cursor->img.w = (unsigned short)*width;
        cursor->img.h = (unsigned short)*height;
        cursor->img.region[0] = (unsigned short)(atlas->custom.x + nk_cursor_data[i][0].x);
        cursor->img.region[1] = (unsigned short)(atlas->custom.y + nk_cursor_data[i][0].y);
        cursor->img.region[2] = (unsigned short)nk_cursor_data[i][1].x;
        cursor->img.region[3] = (unsigned short)nk_cursor_data[i][1].y;
        cursor->size = nk_cursor_data[i][1];
        cursor->offset = nk_cursor_data[i][2];
    }}
    /* free temporary memory */
    atlas->temporary.free(atlas->temporary.userdata, tmp);
    return atlas->pixel;

failed:
    /* error so cleanup all memory */
    if (tmp) atlas->temporary.free(atlas->temporary.userdata, tmp);
    if (atlas->glyphs) {
        atlas->permanent.free(atlas->permanent.userdata, atlas->glyphs);
        atlas->glyphs = 0;
    }
    if (atlas->pixel) {
        atlas->temporary.free(atlas->temporary.userdata, atlas->pixel);
        atlas->pixel = 0;
    }
    return 0;
}